

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O2

bool __thiscall DynamicProfileStorage::StorageInfo::WriteRecord(StorageInfo *this,char *record)

{
  bool bVar1;
  DWORD DVar2;
  char *t;
  char16 local_248 [4];
  char16 cacheFilename [260];
  undefined1 auStack_38 [8];
  DynamicProfileStorageReaderWriter writer;
  
  GetFilename(this,local_248);
  auStack_38 = (undefined1  [8])0x0;
  writer.filename = (char16 *)0x0;
  bVar1 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)auStack_38,local_248,L"wcb",true,
                     (errno_t *)0x0);
  if (bVar1) {
    t = GetRecordBuffer(record);
    DVar2 = GetRecordSize(record);
    bVar1 = DynamicProfileStorageReaderWriter::WriteArray<char_const>
                      ((DynamicProfileStorageReaderWriter *)auStack_38,t,(ulong)DVar2);
    if (bVar1) {
      bVar1 = true;
      DynamicProfileStorageReaderWriter::Close
                ((DynamicProfileStorageReaderWriter *)auStack_38,false);
      goto LAB_0088fd3b;
    }
  }
  else {
    Output::Print(L"ERROR: DynamicProfileStorage: Unable open record file \'%s\'",local_248);
    Output::Flush();
  }
  bVar1 = false;
LAB_0088fd3b:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)auStack_38);
  return bVar1;
}

Assistant:

bool DynamicProfileStorage::StorageInfo::WriteRecord(__in_ecount(sizeof(DWORD) + *record)char const * record) const
{
    char16 cacheFilename[_MAX_PATH];
    this->GetFilename(cacheFilename);
    DynamicProfileStorageReaderWriter writer;
    if (!writer.Init(cacheFilename, _u("wcb"), true))
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable open record file '%s'"), cacheFilename);
        Output::Flush();
        return false;
    }
    if (!writer.WriteArray(GetRecordBuffer(record), GetRecordSize(record)))
    {
        return false;
    }
    // Success
    writer.Close();
    return true;
}